

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::fill(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  Cell index;
  
  requireDStackDepth(this,3,"FILL");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  index = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  for (; uVar2 != 0; uVar2 = uVar2 - 1) {
    dataSpaceSet(this,index,(Char)uVar1);
    index = index + 1;
  }
  return;
}

Assistant:

void fill() {
			REQUIRE_DSTACK_DEPTH(3, "FILL");
			auto ch = static_cast<Char>(dStack.getTop()); pop();
			auto length = dStack.getTop(); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				dataSpaceSet(caddr + i, ch);
			}
		}